

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O0

bignum_t<10> __thiscall bignum_t<10>::operator-(bignum_t<10> *this)

{
  bignum_t<10> bVar1;
  bignum_t<10> result;
  bignum_t<10> *in_stack_ffffffffffffffc8;
  bignum_t<10> *this_00;
  bignum_t<10> local_a;
  
  this_00 = &local_a;
  bignum_t<10>(this_00,in_stack_ffffffffffffffc8);
  CVmObjBigNum::negate(this_00->ext);
  bVar1.ext[0] = local_a.ext[0];
  bVar1.ext[1] = local_a.ext[1];
  bVar1.ext[2] = local_a.ext[2];
  bVar1.ext[3] = local_a.ext[3];
  bVar1.ext[4] = local_a.ext[4];
  bVar1.ext[5] = local_a.ext[5];
  bVar1.ext[6] = local_a.ext[6];
  bVar1.ext[7] = local_a.ext[7];
  bVar1.ext[8] = local_a.ext[8];
  bVar1.ext[9] = local_a.ext[9];
  return (bignum_t<10>)bVar1.ext;
}

Assistant:

bignum_t<prec> operator -()
    {
        bignum_t<prec> result(this);
        CVmObjBigNum::negate(result.ext);
        return result;
    }